

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  pointer pIVar10;
  DataKey DVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  pointer keys;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar13;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  pointer local_130;
  undefined1 local_124 [12];
  uint auStack_118 [2];
  uint local_110 [3];
  undefined3 uStack_103;
  uint local_100 [3];
  bool local_f4;
  undefined8 local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar12 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pnVar3 = (pSVar12->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (pSVar12->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_f0._0_4_ = cpp_dec_float_finite;
  local_f0._4_4_ = 10;
  stack0xfffffffffffffee0 = (undefined1  [16])0x0;
  local_110[0] = 0;
  local_110[1] = 0;
  stack0xfffffffffffffef8 = 0;
  uStack_103 = 0;
  local_100[0] = 0;
  local_100[1] = 0;
  local_100[2] = 0;
  local_f4 = false;
  pIVar10 = (this->pricesCo).data.
            super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pricesCo).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar10) {
    (this->pricesCo).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
  }
  (this->bestPricesCo).super_IdxSet.num = 0;
  lVar13 = (long)(pSVar12->infeasibilitiesCo).super_IdxSet.num;
  keys = pIVar10;
  local_138 = best;
  if (0 < lVar13) {
    uVar14 = lVar13 + 1;
    do {
      pSVar12 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      piVar9 = (pSVar12->infeasibilitiesCo).super_IdxSet.idx;
      iVar2 = piVar9[uVar14 - 2];
      local_178.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_178.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_178.exp = pnVar3[iVar2].m_backend.exp;
      local_178.neg = pnVar3[iVar2].m_backend.neg;
      local_178.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_178.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2)
      ;
      result.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      tol = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)(result.m_backend.data._M_elems[0] | result.m_backend.fpclass);
      if ((result.m_backend.data._M_elems[0] | result.m_backend.fpclass) != cpp_dec_float_finite) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if (local_178.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002c5c06:
        iVar7 = (pSVar12->infeasibilitiesCo).super_IdxSet.num;
        (pSVar12->infeasibilitiesCo).super_IdxSet.num = iVar7 + -1;
        piVar9[uVar14 - 2] = piVar9[(long)iVar7 + -1];
        (pSVar12->isInfeasibleCo).data[iVar2] = 0;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_178,&result.m_backend);
        pSVar12 = (this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
        if (-1 < iVar7) {
          piVar9 = (pSVar12->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_002c5c06;
        }
        (pSVar12->isInfeasibleCo).data[iVar2] = 1;
        uStack_50 = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_178.data._M_elems._0_8_;
        auStack_60[0] = local_178.data._M_elems[2];
        auStack_60[1] = local_178.data._M_elems[3];
        local_58[0] = local_178.data._M_elems[4];
        local_58[1] = local_178.data._M_elems[5];
        local_48[0] = local_178.data._M_elems[8];
        local_48[1] = local_178.data._M_elems[9];
        local_40 = local_178.exp;
        local_3c = local_178.neg;
        local_38 = local_178.fpclass;
        iStack_34 = local_178.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_130[iVar2].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_130[iVar2].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_130[iVar2].m_backend.exp;
        local_a8.m_backend.neg = local_130[iVar2].m_backend.neg;
        local_a8.m_backend.fpclass = local_130[iVar2].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_130[iVar2].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_68,&local_a8,&local_e8,tol);
        local_100[0] = result.m_backend.data._M_elems[8];
        local_100[1] = result.m_backend.data._M_elems[9];
        local_110[0] = result.m_backend.data._M_elems[4];
        local_110[1] = result.m_backend.data._M_elems[5];
        stack0xfffffffffffffef8 = result.m_backend.data._M_elems._24_5_;
        uStack_103 = result.m_backend.data._M_elems[7]._1_3_;
        auStack_118[0] = result.m_backend.data._M_elems[2];
        auStack_118[1] = result.m_backend.data._M_elems[3];
        local_124._4_4_ = result.m_backend.data._M_elems[0];
        local_124._8_4_ = result.m_backend.data._M_elems[1];
        local_100[2] = result.m_backend.exp;
        local_f4 = result.m_backend.neg;
        local_f0._0_4_ = result.m_backend.fpclass;
        local_f0._4_4_ = result.m_backend.prec_elem;
        local_124._0_4_ = iVar2;
        std::
        vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
        ::push_back(&(this->pricesCo).data,(value_type *)local_124);
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
    keys = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pIVar10 = (this->pricesCo).data.
              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  DVar11.info = 0;
  DVar11.idx = -1;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar8 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)((ulong)((long)pIVar10 - (long)keys) >> 2) * -0x11111111
                     ,100,0,0,true);
  if (0 < (int)uVar8) {
    pIVar10 = (this->pricesCo).data.
              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      DIdxSet::addIdx(&this->bestPricesCo,*(int *)((long)&(pIVar10->val).m_backend + lVar13 + -4));
      pIVar10 = (this->pricesCo).data.
                super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasibleCo).data[*(int *)((long)&(pIVar10->val).m_backend + lVar13 + -4)]
           = 2;
      lVar13 = lVar13 + 0x3c;
    } while ((ulong)uVar8 * 0x3c - lVar13 != 0);
    if (0 < (int)uVar8) {
      pIVar10 = (this->pricesCo).data.
                super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_138->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&(pIVar10->val).m_backend + 0x20);
      uVar4 = *(undefined8 *)&(pIVar10->val).m_backend.data;
      uVar5 = *(undefined8 *)((long)&(pIVar10->val).m_backend + 8);
      uVar6 = *(undefined8 *)((long)&(pIVar10->val).m_backend + 0x18);
      *(undefined8 *)((local_138->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)&(pIVar10->val).m_backend + 0x10);
      *(undefined8 *)((local_138->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(local_138->m_backend).data._M_elems = uVar4;
      *(undefined8 *)((local_138->m_backend).data._M_elems + 2) = uVar5;
      (local_138->m_backend).exp = *(int *)((long)&(pIVar10->val).m_backend + 0x28);
      (local_138->m_backend).neg = *(bool *)((long)&(pIVar10->val).m_backend + 0x2c);
      *(undefined8 *)&(local_138->m_backend).fpclass =
           *(undefined8 *)((long)&(pIVar10->val).m_backend + 0x30);
      DVar11 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,
                             ((this->pricesCo).data.
                              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                              ._M_impl.super__Vector_impl_data._M_start)->idx);
    }
  }
  return (SPxId)DVar11;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, weights_ptr[idx], feastol);
         price.idx = idx;
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}